

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall dh::analysis::match(analysis *this,string *c)

{
  __type _Var1;
  int iVar2;
  ostream *poVar3;
  token local_50;
  
  token::getVal_abi_cxx11_
            (&local_50._val,
             (this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  _Var1 = std::operator==(c,&local_50._val);
  std::__cxx11::string::~string((string *)&local_50);
  if (_Var1) {
    scanner::getToken(&local_50,&this->_tokens);
    token::operator=((this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"[ERROR] Incompitable word: \"");
  token::getVal_abi_cxx11_
            (&local_50._val,
             (this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  poVar3 = std::operator<<(poVar3,(string *)&local_50);
  poVar3 = std::operator<<(poVar3,"\" in line ");
  iVar2 = token::getLineno((this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  poVar3 = std::operator<<(poVar3," expect token: \"");
  poVar3 = std::operator<<(poVar3,(string *)c);
  std::operator<<(poVar3,"\"\n");
  std::__cxx11::string::~string((string *)&local_50);
  exit(1);
}

Assistant:

void analysis::match( ::std::string c)
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG IN Match] get " 
		<< tmp->getVal() 
		<< " need " 
		<< c 
		<< ::std::endl;
#endif
	if ( c == tmp->getVal())
	{
		*tmp = _tokens.getToken();
		return ;
	} else 
	{
		::std::cerr << "[ERROR] Incompitable word: \""
			<< tmp->getVal() 
			<< "\" in line "
			<< tmp->getLineno()
			<< " expect token: \""
			<< c
			<< "\"\n";
		::std::exit(1);
	}
}